

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_EnumReservedRangeError_Test::
~ParserValidationErrorTest_EnumReservedRangeError_Test
          (ParserValidationErrorTest_EnumReservedRangeError_Test *this)

{
  ParserValidationErrorTest_EnumReservedRangeError_Test *this_local;
  
  ~ParserValidationErrorTest_EnumReservedRangeError_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, EnumReservedRangeError) {
  ExpectHasValidationErrors(
      "enum Foo {\n"
      "  BAR = 1;\n"
      "  reserved 2 to 1;\n"
      "}\n",
      "2:11: Reserved range end number must be greater than start number.\n");
}